

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
HecrSequential_cyclicRedictionFullMatrix_Test::TestBody
          (HecrSequential_cyclicRedictionFullMatrix_Test *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ulong uVar3;
  char *message;
  AssertionResult gtest_ar;
  vec solution;
  vec xs;
  vec rhs;
  vec cs;
  vec bs;
  vec as;
  TridiagonalMatrix m;
  double xs_values [7];
  double rhs_values [7];
  double cs_values [7];
  double bs_values [7];
  double as_values [7];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  AssertHelper local_250;
  internal local_248 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  vec local_238;
  void *local_220;
  long local_218;
  long local_210;
  vec local_208;
  vec local_1f0;
  vec local_1d8;
  vec local_1c0;
  TridiagonalMatrix local_1a8;
  double local_158 [8];
  double local_118 [4];
  char local_f8 [24];
  double local_e0;
  double local_d8 [8];
  double local_98 [8];
  double local_58 [7];
  
  local_58[4] = 5.5;
  local_58[5] = -6.0;
  local_58[2] = 3.0;
  local_58[3] = 7.0;
  local_58[0] = 3.0;
  local_58[1] = 4.0;
  local_58[6] = 4.0;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_1c0,local_58,
             (double *)&stack0xffffffffffffffe0,(allocator_type *)&local_1a8);
  local_98[0] = 0.0;
  local_98[1] = -1.0;
  local_98[2] = 2.0;
  local_98[3] = 1.1;
  local_98[4] = 3.2;
  local_98[5] = 2.0;
  local_98[6] = 1.0;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_1d8,local_98,local_98 + 7,
             (allocator_type *)&local_1a8);
  local_d8[6] = 0.0;
  local_d8[0] = 2.0;
  local_d8[1] = 0.5;
  local_d8[2] = -0.7;
  local_d8[3] = 1.0;
  local_d8[4] = 0.8;
  local_d8[5] = 1.0;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_1f0,local_d8,local_d8 + 7,
             (allocator_type *)&local_1a8);
  TridiagonalMatrix::TridiagonalMatrix(&local_1a8,&local_1c0,&local_1d8,&local_1f0);
  builtin_strncpy(local_f8,"333333!@",9);
  local_f8[9] = '\0';
  local_f8[10] = '\0';
  local_f8[0xb] = '\0';
  local_f8[0xc] = '\0';
  local_f8[0xd] = '\0';
  local_f8[0xe] = ':';
  local_f8[0xf] = '@';
  local_118[2] = 1.0;
  local_118[3] = 0.9;
  local_118[0] = 7.0;
  local_118[1] = 6.5;
  local_f8[0x10] = '\0';
  local_f8[0x11] = '\0';
  local_f8[0x12] = '\0';
  local_f8[0x13] = '\0';
  local_f8[0x14] = '\0';
  local_f8[0x15] = '\0';
  local_f8[0x16] = '*';
  local_f8[0x17] = '@';
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_208,local_118,&local_e0,
             (allocator_type *)local_158);
  local_158[3] = 0.0;
  local_158[0] = 1.0;
  local_158[1] = 2.0;
  local_158[2] = -1.0;
  local_158[4] = 2.0;
  local_158[5] = -3.0;
  local_158[6] = 4.0;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_220,local_158,local_158 + 7,
             (allocator_type *)&local_238);
  cyclic_reduction(&local_238,&local_1a8,&local_208);
  if (local_218 - (long)local_220 == 0) {
    local_258.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_258.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    uVar3 = 0;
    do {
      pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ABS(*(double *)((long)local_220 + uVar3 * 8) -
                   local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3]);
      if ((double)pbVar1 <= (double)local_258.ptr_) {
        pbVar1 = local_258.ptr_;
      }
      local_258.ptr_ = pbVar1;
      uVar3 = uVar3 + 1;
    } while ((uVar3 & 0xffffffff) < (ulong)(local_218 - (long)local_220 >> 3));
  }
  testing::internal::CmpHelperLT<double,double>
            (local_248,"max_diff(xs, solution)","EPS",(double *)&local_258,&EPS);
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_258);
    if (local_240.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x79,message);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (local_258.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_258.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_258.ptr_ + 8))();
      }
      local_258.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_220 != (void *)0x0) {
    operator_delete(local_220,local_210 - (long)local_220);
  }
  if (local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a8.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a8.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a8.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HecrSequential, cyclicRedictionFullMatrix)
{
    int size = 7;
    const double as_values[] = { 3, 4, 3, 7, 5.5, -6, 4 };
    vec as = make_vector(size, as_values);
    const double bs_values[] = { 0, -1, 2, 1.1, 3.2, 2, 1 };
    vec bs = make_vector(size, bs_values);
    const double cs_values[] = { 2, 0.5, -0.7, 1, 0.8, 1, 0 };
    vec cs = make_vector(size, cs_values);
    TridiagonalMatrix m(as, bs, cs);
    const double rhs_values[] = { 7, 6.5, 1, 0.9, 8.6, 26, 13 };
    vec rhs = make_vector(size, rhs_values);
    const double xs_values[] = { 1, 2, -1, 0, 2, -3, 4 };
    vec xs = make_vector(size, xs_values);

    vec solution = cyclic_reduction(m, rhs);

    EXPECT_LT(max_diff(xs, solution), EPS);
}